

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

void tinyobj::InitMaterial(material_t *material)

{
  int local_14;
  int i;
  material_t *material_local;
  
  std::__cxx11::string::operator=((string *)material,"");
  std::__cxx11::string::operator=((string *)&material->ambient_texname,"");
  std::__cxx11::string::operator=((string *)&material->diffuse_texname,"");
  std::__cxx11::string::operator=((string *)&material->specular_texname,"");
  std::__cxx11::string::operator=((string *)&material->specular_highlight_texname,"");
  std::__cxx11::string::operator=((string *)&material->bump_texname,"");
  std::__cxx11::string::operator=((string *)&material->displacement_texname,"");
  std::__cxx11::string::operator=((string *)&material->alpha_texname,"");
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    material->ambient[local_14] = 0.0;
    material->diffuse[local_14] = 0.0;
    material->specular[local_14] = 0.0;
    material->transmittance[local_14] = 0.0;
    material->emission[local_14] = 0.0;
  }
  material->illum = 0;
  material->dissolve = 1.0;
  material->shininess = 1.0;
  material->ior = 1.0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&material->unknown_parameter);
  return;
}

Assistant:

static void InitMaterial(material_t &material) {
  material.name = "";
  material.ambient_texname = "";
  material.diffuse_texname = "";
  material.specular_texname = "";
  material.specular_highlight_texname = "";
  material.bump_texname = "";
  material.displacement_texname = "";
  material.alpha_texname = "";
  for (int i = 0; i < 3; i++) {
    material.ambient[i] = 0.f;
    material.diffuse[i] = 0.f;
    material.specular[i] = 0.f;
    material.transmittance[i] = 0.f;
    material.emission[i] = 0.f;
  }
  material.illum = 0;
  material.dissolve = 1.f;
  material.shininess = 1.f;
  material.ior = 1.f;
  material.unknown_parameter.clear();
}